

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alSource3f(ALuint name,ALenum param,ALfloat value1,ALfloat value2,ALfloat value3)

{
  ALfloat value3_local;
  ALfloat value2_local;
  ALfloat value1_local;
  ALenum param_local;
  ALuint name_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSource3f);
  IO_UINT32(name);
  IO_ENUM(param);
  IO_FLOAT(value1);
  IO_FLOAT(value2);
  IO_FLOAT(value3);
  (*REAL_alSource3f)(name,param,value1,value2,value3);
  check_source_state_from_name(name);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSource3f(ALuint name, ALenum param, ALfloat value1, ALfloat value2, ALfloat value3)
{
    IO_START(alSource3f);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_FLOAT(value1);
    IO_FLOAT(value2);
    IO_FLOAT(value3);
    REAL_alSource3f(name, param, value1, value2, value3);
    check_source_state_from_name(name);
    IO_END();
}